

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

int __thiscall
QPDF::processXRefSize
          (QPDF *this,QPDFObjectHandle *dict,int entry_size,
          function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  QPDFExc *__return_storage_ptr__;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  basic_string_view<char,_std::char_traits<char>_> __args_01;
  allocator<char> local_61;
  QPDFObjectHandle local_60;
  long local_50 [4];
  longlong size;
  QPDFObjectHandle Size_obj;
  
  lVar3 = SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)entry_size),0);
  iVar2 = 0x7fffffff;
  if (lVar3 < 0x7fffffff) {
    local_50[0] = lVar3;
    iVar2 = QIntC::IntConverter<long_long,_int,_true,_true>::convert(local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"/Size",(allocator<char> *)&local_60);
  QPDFObjectHandle::getKey(&Size_obj,(string *)dict);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"/Size",&local_61);
  QPDFObjectHandle::getKey(&local_60,(string *)dict);
  bVar1 = QPDFObjectHandle::getValueAsInt(&local_60,&size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_50);
  if (bVar1) {
    if (size < 0) {
      __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
      __args_00._M_str = "Cross-reference stream has a negative /Size key";
      __args_00._M_len = 0x2f;
      std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                (__return_storage_ptr__,damaged,__args_00);
    }
    else {
      if (size < iVar2) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&Size_obj.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        return iVar2;
      }
      __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
      __args_01._M_str = "Cross-reference stream has an impossibly large /Size key";
      __args_01._M_len = 0x38;
      std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                (__return_storage_ptr__,damaged,__args_01);
    }
  }
  else {
    __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
    __args._M_str = "Cross-reference stream does not have a proper /Size key";
    __args._M_len = 0x37;
    std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
              (__return_storage_ptr__,damaged,__args);
  }
  __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

int
QPDF::processXRefSize(
    QPDFObjectHandle& dict, int entry_size, std::function<QPDFExc(std::string_view)> damaged)
{
    // Number of entries is limited by the highest possible object id and stream size.
    auto max_num_entries = std::numeric_limits<int>::max();
    if (max_num_entries > (std::numeric_limits<qpdf_offset_t>::max() / entry_size)) {
        max_num_entries = toI(std::numeric_limits<qpdf_offset_t>::max() / entry_size);
    }

    auto Size_obj = dict.getKey("/Size");
    long long size;
    if (!dict.getKey("/Size").getValueAsInt(size)) {
        throw damaged("Cross-reference stream does not have a proper /Size key");
    } else if (size < 0) {
        throw damaged("Cross-reference stream has a negative /Size key");
    } else if (size >= max_num_entries) {
        throw damaged("Cross-reference stream has an impossibly large /Size key");
    }
    // We are not validating that Size <= (Size key of parent xref / trailer).
    return max_num_entries;
}